

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O2

void __thiscall stock::get(stock *this)

{
  int iVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  const_iterator cVar2;
  long lVar3;
  ostream *poVar4;
  allocator local_39;
  key_type local_38;
  
  cppcms::application::response();
  cppcms::http::response::set_plain_text_header();
  cppcms::application::request();
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)cppcms::http::request::get_abi_cxx11_();
  std::__cxx11::string::string((string *)&local_38,"from",&local_39);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  cppcms::application::request();
  lVar3 = cppcms::http::request::get_abi_cxx11_();
  if (cVar2._M_node != (_Base_ptr)(lVar3 + 8)) {
    iVar1 = atoi(*(char **)(cVar2._M_node + 2));
    if (this->counter_ <= iVar1) {
      cppcms::application::release_context();
      std::
      vector<std::shared_ptr<cppcms::http::context>,std::allocator<std::shared_ptr<cppcms::http::context>>>
      ::emplace_back<std::shared_ptr<cppcms::http::context>>
                ((vector<std::shared_ptr<cppcms::http::context>,std::allocator<std::shared_ptr<cppcms::http::context>>>
                  *)&this->all_,(shared_ptr<cppcms::http::context> *)&local_38);
      goto LAB_00119e35;
    }
  }
  cppcms::application::response();
  cppcms::http::response::out();
  poVar4 = std::ostream::_M_insert<double>(this->price_);
  std::endl<char,std::char_traits<char>>(poVar4);
  cppcms::application::release_context();
  cppcms::http::context::async_complete_response();
LAB_00119e35:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
  return;
}

Assistant:

void get()
	{
		response().set_plain_text_header();
		cppcms::http::request::form_type::const_iterator p=request().get().find("from"),
			e=request().get().end();
		if(p==e || atoi(p->second.c_str()) < counter_) {
			response().out() << price_<<std::endl;
			release_context()->async_complete_response();
			return;
		}
		all_.push_back(release_context());
	}